

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spreadhash.cpp
# Opt level: O0

void MurmurHash3_x64_128(void *key,int len,uint32_t seed,void *out)

{
  uint64_t uVar1;
  byte *pbVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  long *in_RCX;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  uint64_t k2;
  uint64_t k1;
  uint8_t *tail;
  uint64_t k2_1;
  uint64_t k1_1;
  int i;
  uint64_t *blocks;
  uint64_t c2;
  uint64_t c1;
  uint64_t h2;
  uint64_t h1;
  int nblocks;
  uint8_t *data;
  ulong local_b0;
  ulong local_a8;
  int local_84;
  ulong local_68;
  ulong local_60;
  
  local_60 = (ulong)in_EDX;
  local_68 = (ulong)in_EDX;
  for (local_84 = 0; local_84 < (int)in_ESI / 0x10; local_84 = local_84 + 1) {
    lVar5 = *(long *)(in_RDI + (long)(local_84 * 2 + 1) * 8);
    uVar1 = rotl64(*(long *)(in_RDI + (long)(local_84 << 1) * 8) * -0x783c846eeebdac2b,'\x1f');
    uVar1 = rotl64(uVar1 * 0x4cf5ad432745937f ^ local_60,'\x1b');
    local_60 = (local_68 + uVar1) * 5 + 0x52dce729;
    uVar1 = rotl64(lVar5 * 0x4cf5ad432745937f,'!');
    uVar1 = rotl64(uVar1 * -0x783c846eeebdac2b ^ local_68,'\x1f');
    local_68 = (local_60 + uVar1) * 5 + 0x38495ab5;
  }
  pbVar2 = (byte *)(in_RDI + ((int)in_ESI / 0x10 << 4));
  local_a8 = 0;
  local_b0 = 0;
  switch(in_ESI & 0xf) {
  case 0xf:
    local_b0 = (ulong)pbVar2[0xe] << 0x30;
  case 0xe:
    local_b0 = (ulong)pbVar2[0xd] << 0x28 ^ local_b0;
  case 0xd:
    local_b0 = (ulong)pbVar2[0xc] << 0x20 ^ local_b0;
  case 0xc:
    local_b0 = (ulong)pbVar2[0xb] << 0x18 ^ local_b0;
  case 0xb:
    local_b0 = (ulong)pbVar2[10] << 0x10 ^ local_b0;
  case 10:
    local_b0 = (ulong)pbVar2[9] << 8 ^ local_b0;
  case 9:
    uVar1 = rotl64((pbVar2[8] ^ local_b0) * 0x4cf5ad432745937f,'!');
    local_68 = uVar1 * -0x783c846eeebdac2b ^ local_68;
  case 8:
    local_a8 = (ulong)pbVar2[7] << 0x38;
  case 7:
    local_a8 = (ulong)pbVar2[6] << 0x30 ^ local_a8;
  case 6:
    local_a8 = (ulong)pbVar2[5] << 0x28 ^ local_a8;
  case 5:
    local_a8 = (ulong)pbVar2[4] << 0x20 ^ local_a8;
  case 4:
    local_a8 = (ulong)pbVar2[3] << 0x18 ^ local_a8;
  case 3:
    local_a8 = (ulong)pbVar2[2] << 0x10 ^ local_a8;
  case 2:
    local_a8 = (ulong)pbVar2[1] << 8 ^ local_a8;
  case 1:
    uVar1 = rotl64((*pbVar2 ^ local_a8) * -0x783c846eeebdac2b,'\x1f');
    local_60 = uVar1 * 0x4cf5ad432745937f ^ local_60;
  default:
    uVar3 = ((long)(int)in_ESI ^ local_68) + ((long)(int)in_ESI ^ local_60);
    uVar4 = uVar3 + ((long)(int)in_ESI ^ local_68);
    uVar3 = (uVar3 >> 0x21 ^ uVar3) * -0xae502812aa7333;
    uVar3 = (uVar3 >> 0x21 ^ uVar3) * -0x3b314601e57a13ad;
    uVar4 = (uVar4 >> 0x21 ^ uVar4) * -0xae502812aa7333;
    uVar4 = (uVar4 >> 0x21 ^ uVar4) * -0x3b314601e57a13ad;
    uVar4 = uVar4 >> 0x21 ^ uVar4;
    lVar5 = uVar4 + (uVar3 >> 0x21 ^ uVar3);
    *in_RCX = lVar5;
    in_RCX[1] = lVar5 + uVar4;
    return;
  }
}

Assistant:

void MurmurHash3_x64_128(const void* key, const int len,
	const uint32_t seed, void* out)
{
	const uint8_t* data = (const uint8_t*)key;
	const int nblocks = len / 16;

	uint64_t h1 = seed;
	uint64_t h2 = seed;

	const uint64_t c1 = BIG_CONSTANT(0x87c37b91114253d5);
	const uint64_t c2 = BIG_CONSTANT(0x4cf5ad432745937f);

	const uint64_t* blocks = (const uint64_t*)(data);

	for (int i = 0; i < nblocks; i++)
	{
		uint64_t k1 = getblock64(blocks, i * 2 + 0);
		uint64_t k2 = getblock64(blocks, i * 2 + 1);

		k1 *= c1; k1 = ROTL64(k1, 31); k1 *= c2; h1 ^= k1;
		h1 = ROTL64(h1, 27); h1 += h2; h1 = h1 * 5 + 0x52dce729;
		k2 *= c2; k2 = ROTL64(k2, 33); k2 *= c1; h2 ^= k2;
		h2 = ROTL64(h2, 31); h2 += h1; h2 = h2 * 5 + 0x38495ab5;
	}

	const uint8_t* tail = (const uint8_t*)(data + nblocks * 16);

	uint64_t k1 = 0;
	uint64_t k2 = 0;

	switch (len & 15)
	{
	case 15: k2 ^= ((uint64_t)tail[14]) << 48;
	case 14: k2 ^= ((uint64_t)tail[13]) << 40;
	case 13: k2 ^= ((uint64_t)tail[12]) << 32;
	case 12: k2 ^= ((uint64_t)tail[11]) << 24;
	case 11: k2 ^= ((uint64_t)tail[10]) << 16;
	case 10: k2 ^= ((uint64_t)tail[9]) << 8;
	case  9: k2 ^= ((uint64_t)tail[8]) << 0;
		k2 *= c2; k2 = ROTL64(k2, 33); k2 *= c1; h2 ^= k2;

	case  8: k1 ^= ((uint64_t)tail[7]) << 56;
	case  7: k1 ^= ((uint64_t)tail[6]) << 48;
	case  6: k1 ^= ((uint64_t)tail[5]) << 40;
	case  5: k1 ^= ((uint64_t)tail[4]) << 32;
	case  4: k1 ^= ((uint64_t)tail[3]) << 24;
	case  3: k1 ^= ((uint64_t)tail[2]) << 16;
	case  2: k1 ^= ((uint64_t)tail[1]) << 8;
	case  1: k1 ^= ((uint64_t)tail[0]) << 0;
		k1 *= c1; k1 = ROTL64(k1, 31); k1 *= c2; h1 ^= k1;
	};
	h1 ^= len; h2 ^= len;

	h1 += h2;
	h2 += h1;

	h1 = fmix64(h1);
	h2 = fmix64(h2);

	h1 += h2;
	h2 += h1;

	((uint64_t*)out)[0] = h1;
	((uint64_t*)out)[1] = h2;
}